

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

Result __thiscall
testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Perform
          (Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  if ((this->fun_).super__Function_base._M_manager != (_Manager_type)0x0) {
    pvVar1 = (*(this->fun_)._M_invoker)((_Any_data *)this);
    return pvVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }